

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O2

OpenMPClause *
OpenMPIfClause::addIfClause
          (OpenMPDirective *directive,OpenMPIfClauseModifier modifier,char *user_defined_modifier)

{
  bool bVar1;
  OpenMPIfClauseModifier OVar2;
  int iVar3;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar4;
  mapped_type *ppvVar5;
  OpenMPIfClause *pOVar6;
  pointer ppOVar7;
  allocator<char> local_89;
  OpenMPClause *new_clause;
  OpenMPIfClauseModifier local_7c;
  OpenMPClause *local_78;
  string current_user_defined_modifier_expression;
  string local_50 [32];
  
  pvVar4 = OpenMPDirective::getClauses(directive,OMPC_if);
  new_clause = (OpenMPClause *)0x0;
  ppOVar7 = (pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish == ppOVar7) {
    pOVar6 = (OpenMPIfClause *)operator_new(0x90);
    OpenMPIfClause(pOVar6,modifier);
    new_clause = (OpenMPClause *)pOVar6;
    if (modifier == OMPC_IF_MODIFIER_user) {
      std::__cxx11::string::assign((char *)&pOVar6->user_defined_modifier);
    }
    pvVar4 = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
    (pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar4,&new_clause);
    current_user_defined_modifier_expression._M_dataplus._M_p =
         (pointer)((ulong)current_user_defined_modifier_expression._M_dataplus._M_p._4_4_ << 0x20);
    ppvVar5 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,(key_type *)&current_user_defined_modifier_expression
                          );
    *ppvVar5 = pvVar4;
LAB_0016164f:
    local_78 = new_clause;
  }
  else {
    local_7c = modifier;
    do {
      if (ppOVar7 ==
          (pvVar4->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        pOVar6 = (OpenMPIfClause *)operator_new(0x90);
        OVar2 = local_7c;
        OpenMPIfClause(pOVar6,local_7c);
        new_clause = (OpenMPClause *)pOVar6;
        if (OVar2 == OMPC_IF_MODIFIER_user) {
          std::__cxx11::string::assign((char *)&pOVar6->user_defined_modifier);
        }
        std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar4,&new_clause);
        goto LAB_0016164f;
      }
      current_user_defined_modifier_expression._M_string_length = 0;
      current_user_defined_modifier_expression._M_dataplus._M_p =
           (pointer)&current_user_defined_modifier_expression.field_2;
      current_user_defined_modifier_expression.field_2._M_local_buf[0] = '\0';
      if (user_defined_modifier != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>(local_50,user_defined_modifier,&local_89)
        ;
        std::__cxx11::string::operator=
                  ((string *)&current_user_defined_modifier_expression,local_50);
        std::__cxx11::string::~string(local_50);
      }
      if (*(OpenMPIfClauseModifier *)&(*ppOVar7)[1]._vptr_OpenMPClause == local_7c) {
        std::__cxx11::string::string(local_50,(string *)&(*ppOVar7)[1].super_SourceLocation);
        iVar3 = std::__cxx11::string::compare((string *)&current_user_defined_modifier_expression);
        std::__cxx11::string::~string(local_50);
        if (iVar3 != 0) goto LAB_00161570;
        new_clause = *ppOVar7;
        bVar1 = true;
        local_78 = new_clause;
      }
      else {
LAB_00161570:
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&current_user_defined_modifier_expression);
      ppOVar7 = ppOVar7 + 1;
    } while (!bVar1);
  }
  return local_78;
}

Assistant:

OpenMPClause* OpenMPIfClause::addIfClause(OpenMPDirective *directive, OpenMPIfClauseModifier modifier, char * user_defined_modifier) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_if);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        };
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_if] = current_clauses;
    } else {
        for (std::vector<OpenMPClause*>::iterator it = current_clauses->begin(); it != current_clauses->end(); ++it) {
            std::string current_user_defined_modifier_expression;
            if (user_defined_modifier) {
                current_user_defined_modifier_expression = std::string(user_defined_modifier);
            };
            if (((OpenMPIfClause*)(*it))->getModifier() == modifier &&
                current_user_defined_modifier_expression.compare(((OpenMPIfClause*)(*it))->getUserDefinedModifier()) == 0) {
                new_clause = (*it);
                return new_clause;
            };
        };
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        }
        current_clauses->push_back(new_clause);
    }
    return new_clause;
}